

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall UdpSocketImpl::WriteThread(UdpSocketImpl *this)

{
  atomic_uchar *paVar1;
  mutex *__mutex;
  function<void_(BaseSocket_*)> *this_00;
  function<void_(BaseSocket_*,_void_*)> *this_01;
  __array _Var2;
  uint __i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ssize_t sVar7;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var8;
  int *piVar9;
  int *piVar10;
  char cVar11;
  unsigned_long __n2;
  ulong __n;
  bool bVar12;
  addrinfo *lstAddr;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
  *local_1e0;
  __array tmp;
  DATA data;
  char *local_178 [4];
  unique_lock<std::mutex> lock;
  timeval local_148;
  fd_set errorfd;
  fd_set writefd;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_mxWrite);
  __mutex = &this->m_mxOutDeque;
  local_1e0 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
               *)&this->m_quOutData;
  piVar10 = &(this->super_BaseSocketImpl).m_iError;
  this_00 = &(this->super_BaseSocketImpl).m_fError;
  this_01 = &(this->super_BaseSocketImpl).m_fErrorParam;
LAB_00119c8c:
  do {
    do {
      if (this->m_bCloseReq == false) {
LAB_00119cae:
        if ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0) {
          while (((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0 &&
                 (this->m_bCloseReq == false))) {
            std::condition_variable::wait((unique_lock *)&this->m_cv);
          }
        }
      }
      else {
        if ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0) goto LAB_0011a1e7;
        if (this->m_bCloseReq == false) goto LAB_00119cae;
      }
    } while ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0);
    writefd.fds_bits[0xe] = 0;
    writefd.fds_bits[0xf] = 0;
    writefd.fds_bits[0xc] = 0;
    writefd.fds_bits[0xd] = 0;
    writefd.fds_bits[10] = 0;
    writefd.fds_bits[0xb] = 0;
    writefd.fds_bits[8] = 0;
    writefd.fds_bits[9] = 0;
    writefd.fds_bits[6] = 0;
    writefd.fds_bits[7] = 0;
    writefd.fds_bits[4] = 0;
    writefd.fds_bits[5] = 0;
    writefd.fds_bits[2] = 0;
    writefd.fds_bits[3] = 0;
    writefd.fds_bits[0] = 0;
    writefd.fds_bits[1] = 0;
    errorfd.fds_bits[0xe] = 0;
    errorfd.fds_bits[0xf] = 0;
    errorfd.fds_bits[0xc] = 0;
    errorfd.fds_bits[0xd] = 0;
    errorfd.fds_bits[10] = 0;
    errorfd.fds_bits[0xb] = 0;
    errorfd.fds_bits[8] = 0;
    errorfd.fds_bits[9] = 0;
    errorfd.fds_bits[6] = 0;
    errorfd.fds_bits[7] = 0;
    errorfd.fds_bits[4] = 0;
    errorfd.fds_bits[5] = 0;
    errorfd.fds_bits[2] = 0;
    errorfd.fds_bits[3] = 0;
    errorfd.fds_bits[0] = 0;
    errorfd.fds_bits[1] = 0;
    local_148.tv_sec = 1;
    local_148.tv_usec = 0;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      writefd.fds_bits[lVar4] = 0;
    }
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      errorfd.fds_bits[lVar4] = 0;
    }
    iVar3 = (this->super_BaseSocketImpl).m_fSock;
    uVar5 = 1L << ((byte)iVar3 & 0x3f);
    writefd.fds_bits[iVar3 / 0x40] = writefd.fds_bits[iVar3 / 0x40] | uVar5;
    errorfd.fds_bits[iVar3 / 0x40] = errorfd.fds_bits[iVar3 / 0x40] | uVar5;
    iVar3 = select(iVar3 + 1,(fd_set *)0x0,(fd_set *)&writefd,(fd_set *)&errorfd,&local_148);
    if (iVar3 != 0) {
      iVar3 = (this->super_BaseSocketImpl).m_fSock;
      if (((ulong)errorfd.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0) {
        if (*piVar10 == 0) {
          data.
          super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ._M_head_impl._M_dataplus._M_p._0_4_ = 4;
          getsockopt(iVar3,1,4,piVar10,(socklen_t *)&data);
          (this->super_BaseSocketImpl).m_iErrLoc = 5;
          bVar12 = (this->super_BaseSocketImpl).m_bStop;
          if (bVar12 == false &&
              (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            std::function<void_(BaseSocket_*,_void_*)>::operator()
                      (this_01,(this->super_BaseSocketImpl).m_pBkRef,
                       (this->super_BaseSocketImpl).m_pvUserData);
          }
          else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                   (_Manager_type)0x0 && bVar12 == false) {
            std::function<void_(BaseSocket_*)>::operator()
                      (this_00,(this->super_BaseSocketImpl).m_pBkRef);
          }
        }
        goto LAB_0011a1e7;
      }
      std::mutex::lock(__mutex);
      std::
      _Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Tuple_impl(&data.
                     super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,&((this->m_quOutData).
                       super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                      super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   );
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop_front((deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1e0);
      LOCK();
      (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
           (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i -
           CONCAT44(data.
                    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl._4_4_,
                    (int)data.
                         super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .
                         super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl);
      UNLOCK();
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      lstAddr = (addrinfo *)0x0;
      cVar11 = (char)&data.
                      super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ;
      lVar4 = std::__cxx11::string::find(cVar11,0x5b);
      lVar6 = std::__cxx11::string::find(cVar11,0x5d);
      if (lVar6 == -1 || lVar4 == -1) {
        lVar4 = std::__cxx11::string::find(cVar11,0x3a);
        if (lVar4 != -1) {
          std::__cxx11::string::substr((ulong)&tmp,(ulong)&data);
          _Var2 = tmp;
          std::__cxx11::string::substr((ulong)local_178,(ulong)&data);
          iVar3 = getaddrinfo((char *)_Var2._M_t.
                                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                              local_178[0],(addrinfo *)0x0,(addrinfo **)&lstAddr);
          goto LAB_00119f5c;
        }
      }
      else {
        std::__cxx11::string::substr
                  ((ulong)&tmp,
                   (ulong)&data.
                           super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  );
        _Var2 = tmp;
        std::__cxx11::string::substr
                  ((ulong)local_178,
                   (ulong)&data.
                           super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  );
        iVar3 = getaddrinfo((char *)_Var2._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                            local_178[0],(addrinfo *)0x0,(addrinfo **)&lstAddr);
LAB_00119f5c:
        std::__cxx11::string::~string((string *)local_178);
        std::__cxx11::string::~string((string *)&tmp);
        if (iVar3 == 0) {
          sVar7 = sendto((this->super_BaseSocketImpl).m_fSock,
                         (void *)data.
                                 super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 .
                                 super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
                                 ._M_head_impl._M_t.
                                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                         (long)(int)data.
                                    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    .
                                    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl,0,
                         (sockaddr *)lstAddr->ai_addr,lstAddr->ai_addrlen);
          freeaddrinfo((addrinfo *)lstAddr);
          if (0 < (int)(uint)sVar7) {
            uVar5 = (ulong)((uint)sVar7 & 0x7fffffff);
            __n = CONCAT44(data.
                           super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .
                           super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl._4_4_,
                           (int)data.
                                super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .
                                super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl) - uVar5;
            if (uVar5 <= CONCAT44(data.
                                  super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .
                                  super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl._4_4_,
                                  (int)data.
                                       super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       .
                                       super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl) &&
                __n != 0) {
              _Var8.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
              .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                   operator_new__(__n);
              memset((void *)_Var8.
                             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                             .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
              tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
              _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                   )(__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                     )_Var8.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              memmove((void *)_Var8.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                      (void *)((long)data.
                                     super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     .
                                     super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
                                     ._M_head_impl._M_t.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                              uVar5),__n);
              std::mutex::lock(__mutex);
              LOCK();
              (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                   (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i +
                   (CONCAT44(data.
                             super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .
                             super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl._4_4_,
                             (int)data.
                                  super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .
                                  super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl) - uVar5
                   );
              UNLOCK();
              local_178[0] = (char *)(CONCAT44(data.
                                               super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               .
                                               super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               .super__Head_base<1UL,_unsigned_long,_false>.
                                               _M_head_impl._4_4_,
                                               (int)data.
                                                  super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .
                                                  super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .super__Head_base<1UL,_unsigned_long,_false>.
                                                  _M_head_impl) - uVar5);
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
              ::
              emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string&>
                        (local_1e0,&tmp,(unsigned_long *)local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data)
              ;
LAB_0011a0c8:
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        (&tmp);
            }
            std::
            _Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Tuple_impl(&data.
                            super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          );
            goto LAB_00119c8c;
          }
          piVar9 = __errno_location();
          iVar3 = *piVar9;
          *piVar10 = iVar3;
          if (iVar3 == 0xb) {
            uVar5 = CONCAT44(data.
                             super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .
                             super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl._4_4_,
                             (int)data.
                                  super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .
                                  super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl);
            _Var8.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                 operator_new__(uVar5);
            memset((void *)_Var8.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar5);
            tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                 (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
                 (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
                 _Var8.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                 _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
            if (uVar5 != 0) {
              memmove((void *)_Var8.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                      (void *)data.
                              super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .
                              super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
                              ._M_head_impl._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar5);
            }
            std::mutex::lock(__mutex);
            LOCK();
            (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                 (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i +
                 CONCAT44(data.
                          super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl._4_4_,
                          (int)data.
                               super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .
                               super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl);
            UNLOCK();
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
            ::
            emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string&>
                      (local_1e0,&tmp,
                       &data.
                        super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
            goto LAB_0011a0c8;
          }
          (this->super_BaseSocketImpl).m_iErrLoc = 6;
          bVar12 = (this->super_BaseSocketImpl).m_bStop;
          if (bVar12 == false &&
              (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            std::function<void_(BaseSocket_*,_void_*)>::operator()
                      (this_01,(this->super_BaseSocketImpl).m_pBkRef,
                       (this->super_BaseSocketImpl).m_pvUserData);
          }
          else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                   (_Manager_type)0x0 && bVar12 == false) {
            std::function<void_(BaseSocket_*)>::operator()
                      (this_00,(this->super_BaseSocketImpl).m_pBkRef);
          }
        }
      }
      std::
      _Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Tuple_impl(&data.
                      super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
      goto LAB_0011a1e7;
    }
    if (this->m_bCloseReq != false) {
LAB_0011a1e7:
      std::unique_lock<std::mutex>::unlock(&lock);
      if ((*piVar10 == 0) && (iVar3 = shutdown((this->super_BaseSocketImpl).m_fSock,1), iVar3 != 0))
      {
        piVar10 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar10;
        (this->super_BaseSocketImpl).m_iErrLoc = 4;
      }
      LOCK();
      paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
      (paVar1->super___atomic_base<unsigned_char>)._M_i =
           (paVar1->super___atomic_base<unsigned_char>)._M_i | 2;
      UNLOCK();
      paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
      LOCK();
      bVar12 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\x03';
      if (bVar12) {
        (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
      if (bVar12) {
        iVar3 = (this->super_BaseSocketImpl).m_fSock;
        if (iVar3 != -1) {
          close(iVar3);
        }
        (this->super_BaseSocketImpl).m_fSock = -1;
        if ((this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager !=
            (_Manager_type)0x0 ||
            (this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
            (_Manager_type)0x0) {
          (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
        }
      }
      std::unique_lock<std::mutex>::~unique_lock(&lock);
      return;
    }
  } while( true );
}

Assistant:

void UdpSocketImpl::WriteThread()
{

    unique_lock<mutex> lock(m_mxWrite);

    while (m_bCloseReq == false || m_atOutBytes != 0)
    {
        if (m_bCloseReq == false && m_atOutBytes == 0)
            m_cv.wait(lock, [&]() noexcept { return m_atOutBytes == 0 ? m_bCloseReq : true; });

        if (m_atOutBytes != 0)
        {
            fd_set writefd{}, errorfd{};
            struct timeval timeout{};

            timeout.tv_sec = 1;
            timeout.tv_usec = 0;
            FD_ZERO(&writefd);
            FD_ZERO(&errorfd);

            FD_SET(m_fSock, &writefd);
            FD_SET(m_fSock, &errorfd);

            if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) == 0)
            {
                if (m_bCloseReq == false) continue;
                break;
            }

            if (FD_ISSET(m_fSock, &errorfd))
            {
                if (m_iError == 0)
                {
                    socklen_t iLen = sizeof(m_iError);
                    getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                    m_iErrLoc = 5;
                    if (m_fErrorParam && m_bStop == false)
                        m_fErrorParam(m_pBkRef, m_pvUserData);
                    else if (m_fError && m_bStop == false)
                        m_fError(m_pBkRef);
                }
                break;
            }

            m_mxOutDeque.lock();
            DATA data = move(m_quOutData.front());
            m_quOutData.pop_front();
            m_atOutBytes -= BUFLEN(data);
            m_mxOutDeque.unlock();

            struct addrinfo *lstAddr = nullptr;
            const size_t nPosS = ADDRESS(data).find('[');
            const size_t nPosE = ADDRESS(data).find(']');
            if (nPosS != string::npos && nPosE != string::npos)
            {
                if (::getaddrinfo(ADDRESS(data).substr(nPosS + 1, nPosE - 1).c_str(), ADDRESS(data).substr(nPosE + 2).c_str(), nullptr, &lstAddr) != 0)
                    break;    // we return 0, because of a wrong address
            }
            else
            {
                const size_t nPos = ADDRESS(data).find(':');
                if (nPos != string::npos)
                {
                    if (::getaddrinfo(ADDRESS(data).substr(0, nPos).c_str(), ADDRESS(data).substr(nPos + 1).c_str(), nullptr, &lstAddr) != 0)
                        break;    // we return 0, because of a wrong address
                }
                else
                    break;    // we return 0, because of a wrong address
            }

            const uint32_t transferred = ::sendto(m_fSock, reinterpret_cast<const char*>(&BUFFER(data)[0]), static_cast<int>(BUFLEN(data)), 0, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen));
            ::freeaddrinfo(lstAddr);
            if (static_cast<int32_t>(transferred) <= 0)
            {
                m_iError = WSAGetLastError();
                if (m_iError != WSAEWOULDBLOCK)
                {
                    m_iErrLoc = 6;
                    if (m_fErrorParam && m_bStop == false)
                        m_fErrorParam(m_pBkRef, m_pvUserData);
                    else if (m_fError && m_bStop == false)
                        m_fError(m_pBkRef);
                    break;
                }
                // Put the not send bytes back into the que if it is not a SSL connection. A SSL connection has the bytes still available
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data));
                copy_n(&BUFFER(data)[0], BUFLEN(data), &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += BUFLEN(data);
                m_quOutData.emplace_front(move(tmp), BUFLEN(data), ADDRESS(data));
                m_mxOutDeque.unlock();
            }
            else if (transferred < BUFLEN(data)) // Less bytes send as buffer size, we put the rast back in your que
            {
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data) - transferred);
                copy_n(&BUFFER(data)[transferred], BUFLEN(data) - transferred, &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += (BUFLEN(data) - transferred);
                m_quOutData.emplace_front(move(tmp), (BUFLEN(data) - transferred), ADDRESS(data));
                m_mxOutDeque.unlock();
            }
        }
    }

    lock.unlock();

    // if we get out of the while loop, the stop request was send or we have an error
    if (m_iError == 0)
    {
        if (::shutdown(m_fSock, SD_SEND) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
            m_iErrLoc = 4;
        }
    }
    m_iShutDownState |= 2;

    unsigned char cExpected = 3;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        if (m_fClosing || m_fClosingParam)
            StartClosingCB();
    }
}